

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list_tests.cpp
# Opt level: O3

void __thiscall
omp_make_loaded_list_empty_test_Test::TestBody(omp_make_loaded_list_empty_test_Test *this)

{
  TypedExpectation<bool_(long_*)> *this_00;
  char *pcVar1;
  WithoutMatchers *extraout_RDX;
  char *in_R9;
  pointer *__ptr;
  loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
  list;
  shared_ptr<(anonymous_namespace)::TestMock> mock;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  AssertHelper local_80;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined4 local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Any_data local_40;
  code *local_30;
  shared_ptr<(anonymous_namespace)::TestMock> local_20;
  
  std::make_shared<(anonymous_namespace)::TestMock>();
  testing::internal::GetWithoutMatchers();
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&((local_20.
                super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->gmock00_LoadDataList_30).super_UntypedFunctionMockerBase,
             local_20.
             super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  pcVar1 = "*mock.get()";
  local_60._0_8_ =
       &(local_20.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->gmock00_LoadDataList_30;
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
             ,0x30,"*mock.get()","LoadDataList");
  testing::internal::GetWithoutMatchers();
  anon_unknown.dwarf_42aad::TestMock::gmock_Count
            ((MockSpec<bool_(long_*)> *)local_60,
             local_20.
             super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             extraout_RDX,(Function<bool_(long_*)> *)pcVar1);
  this_00 = testing::internal::MockSpec<bool_(long_*)>::InternalExpectedAt
                      ((MockSpec<bool_(long_*)> *)local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
                       ,0x32,"*mock.get()","Count");
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(1);
  *local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
            (&local_88,(bool *)local_90._M_head_impl);
  local_78 = local_90._M_head_impl;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._M_pi;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
    }
  }
  local_68 = 0;
  testing::internal::DoAllAction::operator_cast_to_Action
            ((Action<bool_(long_*)> *)&local_40,(DoAllAction *)&local_78);
  testing::internal::TypedExpectation<bool_(long_*)>::WillRepeatedly
            (this_00,(Action<bool_(long_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<long_*>::~MatcherBase((MatcherBase<long_*> *)(local_60 + 8));
  omp::make_loaded_list<(anonymous_namespace)::TestMock>
            ((loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::TestMock,_long,_(anonymous_namespace)::TestValue>_>
              *)&local_40,&local_20);
  local_78 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(local_78._1_7_,local_30 == (code *)0x0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 != (code *)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_78,(AssertionResult *)"std::empty(list)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/make_loaded_list_tests.cpp"
               ,0x37,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._0_8_ != &local_50) {
      operator_delete((void *)local_60._0_8_,(ulong)(local_50._M_allocated_capacity + 1));
    }
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
  }
  if (local_20.super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<(anonymous_namespace)::TestMock,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(omp_make_loaded_list, empty_test) {
  auto mock = std::make_shared<TestMock>();

  EXPECT_CALL(*mock.get(), LoadDataList);

  EXPECT_CALL(*mock.get(), Count)
      .WillRepeatedly(DoAll(SetArgPointee<0>(0), Return(true)));

  auto list = omp::make_loaded_list(mock);

  ASSERT_TRUE(std::empty(list));
  ASSERT_TRUE(std::cbegin(list) == std::cend(list));
}